

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VEnableWrmsNormVectorArray_Serial(N_Vector v,int tf)

{
  int tf_local;
  N_Vector v_local;
  int local_4;
  
  if (v == (N_Vector)0x0) {
    local_4 = -1;
  }
  else if (v->ops == (N_Vector_Ops)0x0) {
    local_4 = -1;
  }
  else {
    if (tf == 0) {
      v->ops->nvwrmsnormvectorarray = (_func_int_int_N_Vector_ptr_N_Vector_ptr_realtype_ptr *)0x0;
    }
    else {
      v->ops->nvwrmsnormvectorarray = N_VWrmsNormVectorArray_Serial;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int N_VEnableWrmsNormVectorArray_Serial(N_Vector v, booleantype tf)
{
  /* check that vector is non-NULL */
  if (v == NULL) return(-1);

  /* check that ops structure is non-NULL */
  if (v->ops == NULL) return(-1);

  /* enable/disable operation */
  if (tf)
    v->ops->nvwrmsnormvectorarray = N_VWrmsNormVectorArray_Serial;
  else
    v->ops->nvwrmsnormvectorarray = NULL;

  /* return success */
  return(0);
}